

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void recomputeColumnsUsed(Select *pSelect,SrcItem *pSrcItem)

{
  Walker w;
  Walker local_38;
  
  if (pSrcItem->pTab != (Table *)0x0) {
    local_38.pParse = (Parse *)0x0;
    local_38.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_38.walkerDepth = 0;
    local_38.eCode = 0;
    local_38._38_2_ = 0;
    local_38.xExprCallback = recomputeColumnsUsedExpr;
    local_38.xSelectCallback = sqlite3SelectWalkNoop;
    pSrcItem->colUsed = 0;
    local_38.u.pSrcItem = pSrcItem;
    sqlite3WalkSelect(&local_38,pSelect);
  }
  return;
}

Assistant:

static void recomputeColumnsUsed(
  Select *pSelect,                 /* The complete SELECT statement */
  SrcItem *pSrcItem                /* Which FROM clause item to recompute */
){
  Walker w;
  if( NEVER(pSrcItem->pTab==0) ) return;
  memset(&w, 0, sizeof(w));
  w.xExprCallback = recomputeColumnsUsedExpr;
  w.xSelectCallback = sqlite3SelectWalkNoop;
  w.u.pSrcItem = pSrcItem;
  pSrcItem->colUsed = 0;
  sqlite3WalkSelect(&w, pSelect);
}